

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_baryonyx::pnm_observer>
::store_if_better(solver_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_baryonyx::pnm_observer>
                  *this,bit_array *x,double current,long i)

{
  bool bVar1;
  double dVar2;
  long i_local;
  double current_local;
  bit_array *x_local;
  solver_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_baryonyx::pnm_observer>
  *this_local;
  
  bVar1 = is_better_solution<baryonyx::itm::minimize_tag,double>(current,(this->m_best).value);
  if (bVar1) {
    bit_array::operator=(&(this->m_best).x,x);
    dVar2 = duration(this);
    (this->m_best).duration = dVar2;
    (this->m_best).loop = i;
    (this->m_best).remaining_constraints = 0;
    (this->m_best).value = current;
  }
  return;
}

Assistant:

void store_if_better(const bit_array& x, double current, long int i)
    {
        if (is_better_solution<Mode>(current, m_best.value)) {
            m_best.x = x;
            m_best.duration = duration();
            m_best.loop = i;
            m_best.remaining_constraints = 0;
            m_best.value = current;
        }
    }